

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sproto.c
# Opt level: O0

void write_ff(uint8_t *src,uint8_t *des,int n)

{
  uint uVar1;
  int local_20;
  int align8_n;
  int i;
  int n_local;
  uint8_t *des_local;
  uint8_t *src_local;
  
  uVar1 = n + 7U & 0xfffffff8;
  *des = 0xff;
  des[1] = (char)((int)uVar1 / 8) + 0xff;
  memcpy(des + 2,src,(long)n);
  for (local_20 = 0; local_20 < (int)(uVar1 - n); local_20 = local_20 + 1) {
    des[n + 2 + local_20] = '\0';
  }
  return;
}

Assistant:

static inline void
write_ff(const uint8_t * src, uint8_t * des, int n) {
	int i;
	int align8_n = (n+7)&(~7);

	des[0] = 0xff;
	des[1] = align8_n/8 - 1;
	memcpy(des+2, src, n);
	for(i=0; i< align8_n-n; i++){
		des[n+2+i] = 0;
	}
}